

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

ENCODING *
cm_expat_XmlInitUnknownEncoding
          (void *mem,int *table,_func_int_void_ptr_char_ptr *convert,void *userData)

{
  uchar uVar1;
  uint result;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  byte bVar7;
  ulong uVar8;
  
  lVar4 = 0;
  do {
    *(undefined1 *)((long)mem + lVar4) = *(undefined1 *)((long)latin1_encoding.enc.scanners + lVar4)
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1d8);
  uVar5 = 0;
  do {
    if (((latin1_encoding.type[uVar5] != '\0') && (latin1_encoding.type[uVar5] != '\x1c')) &&
       (uVar5 != (uint)table[uVar5])) {
      return (ENCODING *)0x0;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x80);
  lVar4 = 0x3e9;
  uVar5 = 0;
  do {
    result = table[uVar5];
    uVar8 = (ulong)result;
    if (uVar8 == 0xffffffff) {
      *(undefined1 *)((long)mem + uVar5 + 0x90) = 1;
      *(undefined2 *)((long)mem + uVar5 * 2 + 0x1e8) = 0xffff;
      *(undefined2 *)((long)mem + uVar5 * 4 + 1000) = 1;
    }
    else {
      bVar7 = (byte)result;
      if ((int)result < 0) {
        if ((int)result < -4) {
          return (ENCODING *)0x0;
        }
        *(byte *)((long)mem + uVar5 + 0x90) = '\x03' - bVar7;
        *(undefined1 *)((long)mem + uVar5 * 4 + 1000) = 0;
        *(undefined2 *)((long)mem + uVar5 * 2 + 0x1e8) = 0;
      }
      else if ((int)result < 0x80) {
        uVar1 = latin1_encoding.type[uVar8];
        if (((uVar1 != '\0') && (uVar1 != '\x1c')) && (uVar5 != uVar8)) {
          return (ENCODING *)0x0;
        }
        *(uchar *)((long)mem + uVar5 + 0x90) = uVar1;
        *(undefined1 *)((long)mem + uVar5 * 4 + 1000) = 1;
        *(byte *)((long)mem + uVar5 * 4 + 0x3e9) = bVar7;
        *(ushort *)((long)mem + uVar5 * 2 + 0x1e8) = -(ushort)(uVar8 == 0) | (ushort)result;
      }
      else {
        iVar2 = checkCharRefNumber(result);
        if (iVar2 < 0) {
          *(undefined1 *)((long)mem + uVar5 + 0x90) = 0;
          *(undefined2 *)((long)mem + uVar5 * 2 + 0x1e8) = 0xffff;
          *(undefined2 *)((long)mem + uVar5 * 4 + 1000) = 1;
        }
        else {
          if (0xffff < (int)result) {
            return (ENCODING *)0x0;
          }
          uVar3 = result >> 5 & 7;
          cVar6 = '\x16';
          if ((*(uint *)((long)namingBitmap +
                        (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[result >> 8] * 0x20 + uVar3 * 4))
               >> (result & 0x1f) & 1) == 0) {
            cVar6 = ((*(uint *)((long)namingBitmap +
                               (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[result >> 8] * 0x20 +
                                      uVar3 * 4)) & 1 << (bVar7 & 0x1f)) == 0) * '\x02' + '\x1a';
          }
          *(char *)((long)mem + uVar5 + 0x90) = cVar6;
          iVar2 = cm_expat_XmlUtf8Encode(result,(char *)((long)mem + lVar4));
          *(char *)((long)mem + uVar5 * 4 + 1000) = (char)iVar2;
          *(ushort *)((long)mem + uVar5 * 2 + 0x1e8) = (ushort)result;
        }
      }
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 4;
    if (uVar5 == 0x100) {
      *(void **)((long)mem + 0x1e0) = userData;
      *(_func_int_void_ptr_char_ptr **)((long)mem + 0x1d8) = convert;
      if (convert != (_func_int_void_ptr_char_ptr *)0x0) {
        *(code **)((long)mem + 400) = unknown_isName;
        *(code **)((long)mem + 0x198) = unknown_isName;
        *(code **)((long)mem + 0x1a0) = unknown_isName;
        *(code **)((long)mem + 0x1a8) = unknown_isNmstrt;
        *(code **)((long)mem + 0x1b0) = unknown_isNmstrt;
        *(code **)((long)mem + 0x1b8) = unknown_isNmstrt;
        *(code **)((long)mem + 0x1c0) = unknown_isInvalid;
        *(code **)((long)mem + 0x1c8) = unknown_isInvalid;
        *(code **)((long)mem + 0x1d0) = unknown_isInvalid;
      }
      *(code **)((long)mem + 0x78) = unknown_toUtf8;
      *(code **)((long)mem + 0x80) = unknown_toUtf16;
      return (ENCODING *)mem;
    }
  } while( true );
}

Assistant:

ENCODING *
XmlInitUnknownEncoding(void *mem,
                       int *table,
                       int (*convert)(void *userData, const char *p),
                       void *userData)
{
  int i;
  struct unknown_encoding *e = mem;
  for (i = 0; i < (int)sizeof(struct normal_encoding); i++)
    ((char *)mem)[i] = ((char *)&latin1_encoding)[i];
  for (i = 0; i < 128; i++)
    if (latin1_encoding.type[i] != BT_OTHER
        && latin1_encoding.type[i] != BT_NONXML
        && table[i] != i)
      return 0;
  for (i = 0; i < 256; i++) {
    int c = table[i];
    if (c == -1) {
      e->normal.type[i] = BT_MALFORM;
      /* This shouldn't really get used. */
      e->utf16[i] = 0xFFFF;
      e->utf8[i][0] = 1;
      e->utf8[i][1] = 0;
    }
    else if (c < 0) {
      if (c < -4)
        return 0;
      e->normal.type[i] = BT_LEAD2 - (c + 2);
      e->utf8[i][0] = 0;
      e->utf16[i] = 0;
    }
    else if (c < 0x80) {
      if (latin1_encoding.type[c] != BT_OTHER
          && latin1_encoding.type[c] != BT_NONXML
          && c != i)
        return 0;
      e->normal.type[i] = latin1_encoding.type[c];
      e->utf8[i][0] = 1;
      e->utf8[i][1] = (char)c;
      e->utf16[i] = c == 0 ? 0xFFFF : c;
    }
    else if (checkCharRefNumber(c) < 0) {
      e->normal.type[i] = BT_NONXML;
      /* This shouldn't really get used. */
      e->utf16[i] = 0xFFFF;
      e->utf8[i][0] = 1;
      e->utf8[i][1] = 0;
    }
    else {
      if (c > 0xFFFF)
        return 0;
      if (UCS2_GET_NAMING(nmstrtPages, c >> 8, c & 0xff))
        e->normal.type[i] = BT_NMSTRT;
      else if (UCS2_GET_NAMING(namePages, c >> 8, c & 0xff))
        e->normal.type[i] = BT_NAME;
      else
        e->normal.type[i] = BT_OTHER;
      e->utf8[i][0] = (char)XmlUtf8Encode(c, e->utf8[i] + 1);
      e->utf16[i] = c;
    }
  }
  e->userData = userData;
  e->convert = convert;
  if (convert) {
    e->normal.isName2 = unknown_isName;
    e->normal.isName3 = unknown_isName;
    e->normal.isName4 = unknown_isName;
    e->normal.isNmstrt2 = unknown_isNmstrt;
    e->normal.isNmstrt3 = unknown_isNmstrt;
    e->normal.isNmstrt4 = unknown_isNmstrt;
    e->normal.isInvalid2 = unknown_isInvalid;
    e->normal.isInvalid3 = unknown_isInvalid;
    e->normal.isInvalid4 = unknown_isInvalid;
  }
  e->normal.enc.utf8Convert = unknown_toUtf8;
  e->normal.enc.utf16Convert = unknown_toUtf16;
  return &(e->normal.enc);
}